

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_data_pipelines.cpp
# Opt level: O0

void data_pipeline_3P_SPS(size_t L,uint w)

{
  char *__s;
  uint in_ESI;
  Taskflow *in_RDI;
  Task test;
  Task datapipeline;
  DataPipeline<tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:710:68)>,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:723:60)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:735:59)>_>
  pl;
  size_t cnt;
  vector<int,_std::allocator<int>_> collection;
  mutex mutex;
  atomic<unsigned_long> j2;
  size_t j3;
  size_t j1;
  Taskflow taskflow;
  size_t N;
  vector<int,_std::allocator<int>_> source;
  size_t maxN;
  Executor executor;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_fffffffffffff9f8;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_fffffffffffffa00;
  allocator<char> *repeat;
  Taskflow *in_stack_fffffffffffffa10;
  size_type in_stack_fffffffffffffa18;
  Executor *this;
  Taskflow *in_stack_fffffffffffffa20;
  Executor *this_00;
  DataPipeline<tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:710:68)>,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:723:60)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:735:59)>_>
  *object;
  FlowBuilder *in_stack_fffffffffffffa48;
  allocator<char> local_569;
  string local_568 [24];
  DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:735:59)>
  *in_stack_fffffffffffffab0;
  DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:723:60)>
  *in_stack_fffffffffffffab8;
  DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:710:68)>
  *in_stack_fffffffffffffac0;
  undefined8 *in_stack_fffffffffffffac8;
  DataPipeline<tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:710:68)>,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:723:60)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:735:59)>_>
  *in_stack_fffffffffffffad0;
  shared_ptr<tf::WorkerInterface> *in_stack_fffffffffffffae8;
  size_t in_stack_fffffffffffffaf0;
  Task in_stack_fffffffffffffaf8;
  undefined1 local_4f9 [41];
  Task local_4d0;
  pointer local_4c8;
  undefined1 *local_4c0;
  undefined1 *local_4b8;
  Taskflow *local_4b0;
  pointer local_480;
  undefined8 *local_478;
  undefined1 *local_470;
  undefined8 local_468;
  undefined8 local_460;
  pointer local_428;
  undefined1 *local_420;
  undefined1 *local_418;
  Taskflow *local_410;
  undefined8 local_2d0;
  undefined1 local_2c8 [24];
  undefined1 local_2b0 [40];
  undefined8 local_288;
  undefined1 local_280 [216];
  pointer local_1a8;
  pointer local_1a0;
  pointer local_198;
  undefined1 local_189 [385];
  Taskflow *local_8;
  
  __s = (char *)(ulong)in_ESI;
  object = (DataPipeline<tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:710:68)>,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:723:60)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:735:59)>_>
            *)(local_189 + 0x31);
  local_8 = in_RDI;
  std::shared_ptr<tf::WorkerInterface>::shared_ptr
            ((shared_ptr<tf::WorkerInterface> *)in_stack_fffffffffffffa00._M_current,
             in_stack_fffffffffffff9f8._M_current);
  tf::Executor::Executor
            ((Executor *)in_stack_fffffffffffffaf8._node,in_stack_fffffffffffffaf0,
             in_stack_fffffffffffffae8);
  std::shared_ptr<tf::WorkerInterface>::~shared_ptr((shared_ptr<tf::WorkerInterface> *)0x12a92e);
  local_189._25_8_ = 100;
  this_00 = (Executor *)local_189;
  std::allocator<int>::allocator((allocator<int> *)0x12a94c);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffa20,
             in_stack_fffffffffffffa18,(allocator_type *)in_stack_fffffffffffffa10);
  std::allocator<int>::~allocator((allocator<int> *)0x12a972);
  local_198 = (pointer)std::vector<int,_std::allocator<int>_>::begin
                                 ((vector<int,_std::allocator<int>_> *)
                                  in_stack_fffffffffffff9f8._M_current);
  local_1a0 = (pointer)std::vector<int,_std::allocator<int>_>::end
                                 ((vector<int,_std::allocator<int>_> *)
                                  in_stack_fffffffffffff9f8._M_current);
  std::iota<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,int>
            (in_stack_fffffffffffffa00,in_stack_fffffffffffff9f8,0);
  for (local_1a8 = (pointer)0x0; local_1a8 < (pointer)0x65;
      local_1a8 = (pointer)((long)&local_1a8->_node + 1)) {
    tf::Taskflow::Taskflow(in_stack_fffffffffffffa20);
    local_280._8_8_ = (pointer)0x0;
    local_280._0_8_ = (pointer)0x0;
    local_288 = 0;
    std::mutex::mutex((mutex *)0x12aa12);
    std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x12aa1f);
    local_2d0 = 1;
    local_428 = local_1a8;
    local_420 = local_189 + 1;
    local_418 = local_280 + 8;
    local_410 = local_8;
    in_stack_fffffffffffffa20 = local_8;
    tf::make_data_pipe<tf::Pipeflow&,int,data_pipeline_3P_SPS(unsigned_long,unsigned_int)::__0>
              ((PipeType)((ulong)in_stack_fffffffffffffa00._M_current >> 0x20),
               (callable_t *)in_stack_fffffffffffff9f8._M_current);
    local_480 = local_1a8;
    local_478 = &local_288;
    local_470 = local_2b0;
    local_468 = local_2c8;
    local_460 = local_8;
    tf::make_data_pipe<int,int,data_pipeline_3P_SPS(unsigned_long,unsigned_int)::__1>
              ((PipeType)((ulong)in_stack_fffffffffffffa00._M_current >> 0x20),
               (callable_t *)in_stack_fffffffffffff9f8._M_current);
    local_4c8 = local_1a8;
    local_4c0 = local_189 + 1;
    local_4b8 = local_280;
    local_4b0 = local_8;
    tf::make_data_pipe<int,void,data_pipeline_3P_SPS(unsigned_long,unsigned_int)::__2>
              ((PipeType)((ulong)in_stack_fffffffffffffa00._M_current >> 0x20),
               (callable_t *)in_stack_fffffffffffff9f8._M_current);
    tf::
    DataPipeline<tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_data_pipelines.cpp:710:68)>,_tf::DataPipe<int,_int,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_data_pipelines.cpp:723:60)>,_tf::DataPipe<int,_void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_data_pipelines.cpp:735:59)>_>
    ::DataPipeline(in_stack_fffffffffffffad0,(size_t)in_stack_fffffffffffffac8,
                   in_stack_fffffffffffffac0,in_stack_fffffffffffffab8,in_stack_fffffffffffffab0);
    tf::FlowBuilder::
    composed_of<tf::DataPipeline<tf::DataPipe<tf::Pipeflow&,int,data_pipeline_3P_SPS(unsigned_long,unsigned_int)::__0>,tf::DataPipe<int,int,data_pipeline_3P_SPS(unsigned_long,unsigned_int)::__1>,tf::DataPipe<int,void,data_pipeline_3P_SPS(unsigned_long,unsigned_int)::__2>>>
              (in_stack_fffffffffffffa48,object);
    this = (Executor *)local_4f9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)object,__s,
               (allocator<char> *)this_00);
    in_stack_fffffffffffffa10 =
         (Taskflow *)
         tf::Task::name((Task *)in_stack_fffffffffffffa00._M_current,
                        (string *)in_stack_fffffffffffff9f8._M_current);
    tf::Task::Task(&local_4d0,(Task *)in_stack_fffffffffffffa10);
    std::__cxx11::string::~string((string *)(local_4f9 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_4f9);
    in_stack_fffffffffffffab8 =
         (DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:723:60)>
          *)(local_280 + 8);
    in_stack_fffffffffffffac0 =
         (DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:710:68)>
          *)&local_1a8;
    in_stack_fffffffffffffac8 = &local_288;
    in_stack_fffffffffffffad0 =
         (DataPipeline<tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:710:68)>,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:723:60)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:735:59)>_>
          *)local_280;
    tf::FlowBuilder::
    emplace<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:744:34),_nullptr>
              (in_stack_fffffffffffffa48,(anon_class_56_7_2f827206 *)object);
    repeat = &local_569;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)object,__s,
               (allocator<char> *)this_00);
    in_stack_fffffffffffffa00._M_current =
         (int *)tf::Task::name(in_stack_fffffffffffffa00._M_current,
                               in_stack_fffffffffffff9f8._M_current);
    tf::Task::Task((Task *)&stack0xfffffffffffffaf8,(Task *)in_stack_fffffffffffffa00._M_current);
    std::__cxx11::string::~string(local_568);
    std::allocator<char>::~allocator(&local_569);
    tf::Task::precede<tf::Task&>
              ((Task *)in_stack_fffffffffffffa00._M_current,
               (Task *)in_stack_fffffffffffff9f8._M_current);
    in_stack_fffffffffffffa48 = (FlowBuilder *)(local_280 + 8);
    tf::Executor::run_n<data_pipeline_3P_SPS(unsigned_long,unsigned_int)::__4>
              (this,in_stack_fffffffffffffa10,(size_t)repeat,
               (anon_class_40_5_fba60c21 *)in_stack_fffffffffffffa00._M_current);
    std::future<void>::get((future<void> *)in_stack_fffffffffffffa10);
    tf::Future<void>::~Future((Future<void> *)in_stack_fffffffffffffa00._M_current);
    tf::
    DataPipeline<tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_data_pipelines.cpp:710:68)>,_tf::DataPipe<int,_int,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_data_pipelines.cpp:723:60)>,_tf::DataPipe<int,_void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_data_pipelines.cpp:735:59)>_>
    ::~DataPipeline((DataPipeline<tf::DataPipe<tf::Pipeflow_&,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:710:68)>,_tf::DataPipe<int,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:723:60)>,_tf::DataPipe<int,_void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_data_pipelines_cpp:735:59)>_>
                     *)in_stack_fffffffffffffa00._M_current);
    std::vector<int,_std::allocator<int>_>::~vector
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffa10);
    tf::Taskflow::~Taskflow((Taskflow *)in_stack_fffffffffffffa00._M_current);
  }
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffa10);
  tf::Executor::~Executor(this_00);
  return;
}

Assistant:

void data_pipeline_3P_SPS(size_t L, unsigned w) {

  tf::Executor executor(w);

  const size_t maxN = 100;

  std::vector<int> source(maxN);
  std::iota(source.begin(), source.end(), 0);
  // std::vector<std::array<int, 3>> mybuffer(L);

  for(size_t N = 0; N <= maxN; N++) {

    tf::Taskflow taskflow;

    size_t j1 = 0, j3 = 0;
    std::atomic<size_t> j2 = 0;
    std::mutex mutex;
    std::vector<int> collection;
    size_t cnt = 1;

    tf::DataPipeline pl(L,
      tf::make_data_pipe<tf::Pipeflow&, int>(tf::PipeType::SERIAL, [N, &source, &j1, L](tf::Pipeflow& pf) mutable {
        if(j1 == N) {
          pf.stop();
          return 0;
        }
        REQUIRE(j1 == source[j1]);
        REQUIRE(pf.token() % L == pf.line());
        //*(pf.output()) = source[j1] + 1;
        // mybuffer[pf.line()][pf.pipe()] = source[j1] + 1;
        // j1++;
        return source[j1++] + 1;
      }),

      tf::make_data_pipe<int, int>(tf::PipeType::PARALLEL, [N, &j2, &mutex, &collection, L](int input, tf::Pipeflow& pf) mutable {
        REQUIRE(j2++ < N);
        //*(pf.output()) = *(pf.input()) + 1;
        {
          std::scoped_lock<std::mutex> lock(mutex);
          // mybuffer[pf.line()][pf.pipe()] = mybuffer[pf.line()][pf.pipe() - 1] + 1;
          REQUIRE(pf.token() % L == pf.line());
          collection.push_back(input);
          return input + 1;
        }
      }),

      tf::make_data_pipe<int, void>(tf::PipeType::SERIAL, [N, &source, &j3, L](int input, tf::Pipeflow& pf) mutable {
        REQUIRE(j3 < N);
        REQUIRE(pf.token() % L == pf.line());
        REQUIRE(source[j3] + 2 == input);
        j3++;
      })
    );

    auto datapipeline = taskflow.composed_of(pl).name("module_of_datapipeline");
    auto test = taskflow.emplace([&](){
      REQUIRE(j1 == N);
      REQUIRE(j2 == N);
      REQUIRE(j3 == N);
      REQUIRE(collection.size() == N);

      std::sort(collection.begin(), collection.end());
      for (size_t i = 0; i < N; ++i) {
        REQUIRE(collection[i] == i + 1);
      }
      REQUIRE(pl.num_tokens() == cnt * N);

    }).name("test");

    datapipeline.precede(test);

    executor.run_n(taskflow, 3, [&]() mutable {
      j1 = j2 = j3 = 0;
      collection.clear();
      // for(size_t i = 0; i < mybuffer.size(); ++i){
      //   for(size_t j = 0; j < mybuffer[0].size(); ++j){
      //     mybuffer[i][j] = 0;
      //   }
      // }

      cnt++;
    }).get();
  }
}